

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

void __thiscall ON_PolylineCurve::Dump(ON_PolylineCurve *this,ON_TextLog *dump)

{
  double dVar1;
  double this_00;
  int iVar2;
  double *pdVar3;
  ON_3dPoint *p;
  uint local_2c;
  undefined1 auStack_28 [4];
  int i;
  ON_Interval d;
  ON_TextLog *dump_local;
  ON_PolylineCurve *this_local;
  
  d.m_t[1] = (double)dump;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  this_00 = d.m_t[1];
  pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_28,0);
  dVar1 = *pdVar3;
  pdVar3 = ON_Interval::operator[]((ON_Interval *)auStack_28,1);
  ON_TextLog::Print((ON_TextLog *)this_00,"ON_PolylineCurve:  domain = [%g,%g]\n",dVar1,*pdVar3);
  local_2c = 0;
  while( true ) {
    iVar2 = PointCount(this);
    if (iVar2 <= (int)local_2c) break;
    ON_TextLog::Print((ON_TextLog *)d.m_t[1],"  point[%2d] = ",(ulong)local_2c);
    dVar1 = d.m_t[1];
    p = ON_SimpleArray<ON_3dPoint>::operator[]
                  ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_2c);
    ON_TextLog::Print((ON_TextLog *)dVar1,p);
    dVar1 = d.m_t[1];
    pdVar3 = ON_SimpleArray<double>::operator[](&this->m_t,local_2c);
    ON_TextLog::Print((ON_TextLog *)dVar1,", %g\n",*pdVar3);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void ON_PolylineCurve::Dump( ON_TextLog& dump ) const
{
  ON_Interval d = Domain();
  dump.Print( "ON_PolylineCurve:  domain = [%g,%g]\n",d[0],d[1]);
  for ( int i = 0; i < PointCount(); i++ ) {
    dump.Print( "  point[%2d] = ",i);
    dump.Print( m_pline[i] );
    dump.Print( ", %g\n",m_t[i]);
  }
}